

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O2

void makelabel(int tabindex,char *label)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  char indexstr [5];
  char local_2d [5];
  
  *label = '\0';
  switch(symtab[tabindex].symtype) {
  case stprogram:
  case stparameter:
  case stvariable:
  case stprocedure:
    iVar2 = symtab[tabindex].thisname;
    iVar7 = nametable[iVar2].strstart;
    lVar5 = (long)iVar7;
    for (lVar6 = 0;
        (lVar1 = lVar5 + lVar6, lVar1 < (long)iVar7 + (long)nametable[iVar2].strlength &&
        (lVar1 < iVar7 + 5)); lVar6 = lVar6 + 1) {
      label[lVar6] = stringtable[lVar1];
      iVar7 = nametable[iVar2].strstart;
    }
    label[lVar6] = '\0';
    sVar3 = strlen(label);
    if (sVar3 < 5) goto switchD_001076c7_caseD_6;
    break;
  default:
    goto switchD_001076c7_caseD_6;
  case stlabel:
    builtin_strncpy(label,"_loop",6);
    break;
  case stliteral:
    if (symtab[tabindex].dataclass == dtinteger) {
      iVar2 = symtab[tabindex].thisname;
      iVar7 = nametable[iVar2].strstart;
      lVar6 = (long)iVar7;
      for (uVar4 = 0; (long)(lVar6 + uVar4) < (long)iVar7 + (long)nametable[iVar2].strlength;
          uVar4 = uVar4 + 1) {
        label[uVar4] = stringtable[lVar6 + uVar4];
        iVar7 = nametable[iVar2].strstart;
      }
      label[uVar4 & 0xffffffff] = '\0';
      goto switchD_001076c7_caseD_6;
    }
  case sttempvar:
    label[0] = '_';
    label[1] = 't';
    label[2] = '\0';
  }
  sprintf(local_2d,"%d",(ulong)(uint)tabindex);
  strcat(label,local_2d);
switchD_001076c7_caseD_6:
  strcpy(symtab[tabindex].label,label);
  return;
}

Assistant:

void	makelabel(int tabindex, char *label)
{
    int		i, j, k;
    char		indexstr[5];
    
    label[0] = '\0';
    switch (symclass(tabindex))	{
        case stliteral:
            if (data_class(tabindex) == dtinteger)	{
                i = symtab[tabindex].thisname;
                
                for  (k = 0, j = nametable[i].strstart;
                      j < nametable[i].strstart+
                      nametable[i].strlength;
                      j++, k++)
                    label[k] = stringtable[j];
                label[k] = '\0';
                break;
            }
            
            
        case sttempvar:
            label[0] = '_';
            label[1] = 't';
            label[2] = '\0';
            //itoa(tabindex, indexstr, 10);
            sprintf(indexstr, "%d", tabindex);
            strcat(label, indexstr);
            break;
            
        case stlabel:
            strcpy(label, "_loop");
            //itoa(tabindex, indexstr, 10);
            sprintf(indexstr, "%d", tabindex);
            strcat(label, indexstr);
            break;
        case stprogram:
        case stvariable:
        case stparameter:
        case stprocedure:
            i = symtab[tabindex].thisname;
            
            for (k = 0, j = nametable[i].strstart; j < nametable[i].strstart+nametable[i].strlength && j < nametable[i].strstart+5; j++, k++)
                label[k] = stringtable[j];
            label[k] = '\0';
            if (strlen(label) >= 5)	{
                //itoa(tabindex, indexstr, 10);
                sprintf(indexstr, "%d", tabindex);
                strcat(label, indexstr);
            }
            
        default: break;
    }
    strcpy(symtab[tabindex].label, label);
    //printf("Tabindex is %d\n", tabindex);
}